

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

bool TranslateModuleImports
               (ExpressionTranslateContext *ctx,SmallArray<const_char_*,_32U> *dependencies)

{
  InplaceStr *this;
  uint uVar1;
  ModuleData *pMVar2;
  OutputContext *pOVar3;
  bool bVar4;
  int iVar5;
  ModuleData **ppMVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  ByteCode *code;
  char *pcVar10;
  ExprModule *expression;
  size_t sVar11;
  uint k;
  uint uVar12;
  uint index;
  ExpressionContext *pEVar13;
  uint index_00;
  char *local_b230;
  char *targetName;
  uint fileSize;
  ExpressionTranslateContext nested;
  char path [1024];
  char nextModuleRootBuf [1024];
  CompilerContext local_a880;
  
  index_00 = 1;
LAB_00237a13:
  pEVar13 = ctx->ctx;
  uVar1 = (pEVar13->imports).count;
  if (index_00 < uVar1) {
    ppMVar6 = SmallArray<ModuleData_*,_128U>::operator[](&pEVar13->imports,index_00);
    pMVar2 = *ppMVar6;
    this = &pMVar2->name;
    targetName = GetModuleOutputPath(ctx->allocator,pMVar2->name);
    uVar12 = 0;
    do {
      if (dependencies->count <= uVar12) {
        SmallArray<const_char_*,_32U>::push_back(dependencies,&targetName);
        if (*(pMVar2->name).end != '\0') {
          __assert_fail("*data->name.end == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                        ,0x7ee,
                        "bool TranslateModuleImports(ExpressionTranslateContext &, SmallArray<const char *, 32> &)"
                       );
        }
        pcVar8 = strstr(this->begin,".nc");
        if (pcVar8 == (char *)0x0) {
          __assert_fail("strstr(data->name.begin, \".nc\") != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                        ,0x7ef,
                        "bool TranslateModuleImports(ExpressionTranslateContext &, SmallArray<const char *, 32> &)"
                       );
        }
        fileSize = 0;
        uVar12 = 0;
        goto LAB_00237acd;
      }
      ppcVar7 = SmallArray<const_char_*,_32U>::operator[](dependencies,uVar12);
      iVar5 = strcmp(*ppcVar7,targetName);
      uVar12 = uVar12 + 1;
    } while (iVar5 != 0);
    goto LAB_00237de7;
  }
  uVar12 = uVar1;
  for (index = 1; index < uVar12; index = index + 1) {
    ppMVar6 = SmallArray<ModuleData_*,_128U>::operator[](&pEVar13->imports,index);
    PrintIndentedLine(ctx,"// Requires \'%.*s\'",
                      (ulong)(uint)(*(int *)&((*ppMVar6)->name).end - (int)((*ppMVar6)->name).begin)
                     );
    pEVar13 = ctx->ctx;
    uVar12 = (pEVar13->imports).count;
  }
LAB_00237f65:
  return uVar1 <= index_00;
  while( true ) {
    uVar12 = uVar12 + 1;
    NULLC::SafeSprintf(path,0x400,"%s%.*s");
    pcVar9 = (char *)(*(code *)NULLC::fileLoad)(path);
    if (pcVar9 != (char *)0x0) break;
LAB_00237acd:
    pcVar8 = BinaryCache::EnumImportPath(uVar12);
    if (pcVar8 == (char *)0x0) {
      if (*(pMVar2->name).end != '\0') {
        __assert_fail("*data->name.end == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                      ,0x805,
                      "bool TranslateModuleImports(ExpressionTranslateContext &, SmallArray<const char *, 32> &)"
                     );
      }
      code = (ByteCode *)BinaryCache::FindBytecode(this->begin,false);
      if (code == (ByteCode *)0x0) {
        pcVar8 = (pMVar2->name).begin;
        NULLC::SafeSprintf(ctx->errorBuf,(ulong)ctx->errorBufSize,
                           "ERROR: module \'%.*s\' input file \'%s\' could not be opened",
                           (ulong)(uint)(*(int *)&(pMVar2->name).end - (int)pcVar8),pcVar8,path);
        goto LAB_00237f65;
      }
      pcVar9 = FindSource(code);
      break;
    }
  }
  pcVar10 = InplaceStr::rfind(this,'/');
  if (pcVar10 == (char *)0x0) {
    local_b230 = (char *)0x0;
  }
  else {
    local_b230 = nextModuleRootBuf;
    NULLC::SafeSprintf(local_b230,0x400,"%.*s");
  }
  CompilerContext::CompilerContext(&local_a880,ctx->allocator,0,(ArrayView<InplaceStr>)ZEXT816(0));
  local_a880.errorBuf = ctx->errorBuf;
  local_a880.errorBufSize = ctx->errorBufSize;
  pOVar3 = ctx->output;
  local_a880.outputCtx.openStream = pOVar3->openStream;
  local_a880.outputCtx.writeStream = pOVar3->writeStream;
  local_a880.outputCtx.closeStream = pOVar3->closeStream;
  local_a880.outputCtx.outputBuf = pOVar3->outputBuf;
  local_a880.outputCtx.outputBufSize = pOVar3->outputBufSize;
  local_a880.outputCtx.tempBuf = pOVar3->tempBuf;
  local_a880.outputCtx.tempBufSize = pOVar3->tempBufSize;
  local_a880.moduleRoot = local_b230;
  local_a880.code = pcVar9;
  expression = AnalyzeModuleFromSource(&local_a880);
  local_a880.code = (char *)0x0;
  if (expression == (ExprModule *)0x0) {
    if (ctx->errorPos != (char *)0x0) {
      ctx->errorPos = local_a880.errorPos;
    }
    pcVar10 = ctx->errorBuf;
    if ((pcVar10 != (char *)0x0) && (uVar12 = ctx->errorBufSize, uVar12 != 0)) {
      sVar11 = strlen(pcVar10);
      NULLC::SafeSprintf(pcVar10 + (sVar11 & 0xffffffff),(ulong)(uVar12 - (int)sVar11),
                         " [in module \'%.*s\']",
                         (ulong)(uint)(*(int *)&(pMVar2->name).end - (int)(pMVar2->name).begin));
    }
    if (pcVar8 != (char *)0x0) {
      (*(code *)NULLC::fileFree)(pcVar9);
    }
  }
  else {
    nested.ctx = &local_a880.exprCtx;
    nested.output = &local_a880.outputCtx;
    nested.loopBreakIdStack.allocator = local_a880.allocator;
    nested.loopBreakIdStack.data = nested.loopBreakIdStack.little;
    nested.loopBreakIdStack.count = 0;
    nested.loopBreakIdStack.max = 0x20;
    nested.loopContinueIdStack.allocator = local_a880.allocator;
    nested.loopContinueIdStack.data = nested.loopContinueIdStack.little;
    nested.loopContinueIdStack.count = 0;
    nested.loopContinueIdStack.max = 0x20;
    nested.allocator = local_a880.allocator;
    nested.mainName = "main";
    nested.indent = "\t";
    nested.errorBufSize = 0;
    nested.depth = 0;
    nested.errorPos = (char *)0x0;
    nested.errorBuf = (char *)0x0;
    nested.nextLoopBreakId = 1;
    nested.nextLoopContinueId = 1;
    nested.nextReturnValueId = 1;
    nested.skipFunctionDefinitions = false;
    nested.currentFunction = (FunctionData *)0x0;
    if (local_a880.outputCtx.stream != (void *)0x0) {
      __assert_fail("!compilerCtx.outputCtx.stream",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0x84a,
                    "bool TranslateModuleImports(ExpressionTranslateContext &, SmallArray<const char *, 32> &)"
                   );
    }
    local_a880.outputCtx.stream = (*local_a880.outputCtx.openStream)(targetName);
    if (local_a880.outputCtx.stream == (void *)0x0) {
      pcVar10 = (pMVar2->name).begin;
      NULLC::SafeSprintf(ctx->errorBuf,(ulong)ctx->errorBufSize,
                         "ERROR: module \'%.*s\' output file \'%s\' could not be opened",
                         (ulong)(uint)(*(int *)&(pMVar2->name).end - (int)pcVar10),pcVar10,path);
      if (pcVar8 != (char *)0x0) {
        (*(code *)NULLC::fileFree)(pcVar9);
      }
    }
    else {
      nested.mainName = GetModuleMainName(ctx->allocator,pMVar2->name);
      nested.indent = ctx->indent;
      nested.errorBuf = ctx->errorBuf;
      nested.errorBufSize = ctx->errorBufSize;
      bVar4 = TranslateModule(&nested,expression,dependencies);
      if (bVar4) {
        (*local_a880.outputCtx.closeStream)(local_a880.outputCtx.stream);
        local_a880.outputCtx.stream = (void *)0x0;
        if (pcVar8 != (char *)0x0) {
          (*(code *)NULLC::fileFree)(pcVar9);
        }
        ExpressionTranslateContext::~ExpressionTranslateContext(&nested);
        CompilerContext::~CompilerContext(&local_a880);
LAB_00237de7:
        index_00 = index_00 + 1;
        goto LAB_00237a13;
      }
      pcVar10 = ctx->errorBuf;
      sVar11 = strlen(pcVar10);
      NULLC::SafeSprintf(pcVar10 + (sVar11 & 0xffffffff),(ulong)(ctx->errorBufSize - (int)sVar11),
                         " [in module \'%.*s\']",
                         (ulong)(uint)(*(int *)&(pMVar2->name).end - (int)(pMVar2->name).begin));
      (*local_a880.outputCtx.closeStream)(local_a880.outputCtx.stream);
      local_a880.outputCtx.stream = (void *)0x0;
      if (pcVar8 != (char *)0x0) {
        (*(code *)NULLC::fileFree)(pcVar9);
      }
    }
    ExpressionTranslateContext::~ExpressionTranslateContext(&nested);
  }
  CompilerContext::~CompilerContext(&local_a880);
  goto LAB_00237f65;
}

Assistant:

bool TranslateModuleImports(ExpressionTranslateContext &ctx, SmallArray<const char*, 32> &dependencies)
{
	// Translate all imports (expept base)
	for(unsigned i = 1; i < ctx.ctx.imports.size(); i++)
	{
		ModuleData *data = ctx.ctx.imports[i];

		const char *targetName = GetModuleOutputPath(ctx.allocator, data->name);

		bool found = false;

		for(unsigned k = 0; k < dependencies.size(); k++)
		{
			if(strcmp(dependencies[k], targetName) == 0)
			{
				found = true;
				break;
			}
		}

		if(found)
			continue;

		dependencies.push_back(targetName);

		assert(*data->name.end == 0);
		assert(strstr(data->name.begin, ".nc") != NULL);

		unsigned fileSize = 0;
		char *fileContent = NULL;
		bool bytecodeFile = false;

		const unsigned pathLength = 1024;
		char path[pathLength];

		unsigned modulePathPos = 0;
		while(const char *modulePath = BinaryCache::EnumImportPath(modulePathPos++))
		{
			NULLC::SafeSprintf(path, pathLength, "%s%.*s", modulePath, FMT_ISTR(data->name));

			fileContent = (char*)NULLC::fileLoad(path, &fileSize);

			if(fileContent)
				break;
		}

		if(!fileContent)
		{
			assert(*data->name.end == 0);

			const char *bytecode = BinaryCache::FindBytecode(data->name.begin, false);

			if(!bytecode)
			{
				NULLC::SafeSprintf(ctx.errorBuf, ctx.errorBufSize, "ERROR: module '%.*s' input file '%s' could not be opened", FMT_ISTR(data->name), path);
				return false;
			}

			fileContent = FindSource((ByteCode*)bytecode);
			bytecodeFile = true;
		}

		const unsigned nextModuleRootLength = 1024;
		char nextModuleRootBuf[nextModuleRootLength];

		const char *nextModuleRoot = NULL;

		if(const char *pos = data->name.rfind('/'))
		{
			NULLC::SafeSprintf(nextModuleRootBuf, nextModuleRootLength, "%.*s", unsigned(pos - data->name.begin), data->name.begin);

			nextModuleRoot = nextModuleRootBuf;
		}

		CompilerContext compilerCtx(ctx.allocator, 0, ArrayView<InplaceStr>());

		compilerCtx.errorBuf = ctx.errorBuf;
		compilerCtx.errorBufSize = ctx.errorBufSize;

		compilerCtx.outputCtx.openStream = ctx.output.openStream;
		compilerCtx.outputCtx.writeStream = ctx.output.writeStream;
		compilerCtx.outputCtx.closeStream = ctx.output.closeStream;

		compilerCtx.outputCtx.outputBuf = ctx.output.outputBuf;
		compilerCtx.outputCtx.outputBufSize = ctx.output.outputBufSize;

		compilerCtx.outputCtx.tempBuf = ctx.output.tempBuf;
		compilerCtx.outputCtx.tempBufSize = ctx.output.tempBufSize;

		compilerCtx.code = fileContent;
		compilerCtx.moduleRoot = nextModuleRoot;

		ExprModule* nestedModule = AnalyzeModuleFromSource(compilerCtx);

		if(!nestedModule)
		{
			compilerCtx.code = NULL;

			if(ctx.errorPos)
				ctx.errorPos = compilerCtx.errorPos;

			if(ctx.errorBuf && ctx.errorBufSize)
			{
				unsigned currLen = (unsigned)strlen(ctx.errorBuf);
				NULLC::SafeSprintf(ctx.errorBuf + currLen, ctx.errorBufSize - currLen, " [in module '%.*s']", FMT_ISTR(data->name));
			}

			if(!bytecodeFile)
				NULLC::fileFree(fileContent);

			return false;
		}

		compilerCtx.code = NULL;

		ExpressionTranslateContext nested(compilerCtx.exprCtx, compilerCtx.outputCtx, compilerCtx.allocator);

		assert(!compilerCtx.outputCtx.stream);

		compilerCtx.outputCtx.stream = compilerCtx.outputCtx.openStream(targetName);

		if(!compilerCtx.outputCtx.stream)
		{
			NULLC::SafeSprintf(ctx.errorBuf, ctx.errorBufSize, "ERROR: module '%.*s' output file '%s' could not be opened", FMT_ISTR(data->name), path);

			if(!bytecodeFile)
				NULLC::fileFree(fileContent);

			return false;
		}

		nested.mainName = GetModuleMainName(ctx.allocator, data->name);

		nested.indent = ctx.indent;

		nested.errorBuf = ctx.errorBuf;
		nested.errorBufSize = ctx.errorBufSize;

		if(!TranslateModule(nested, nestedModule, dependencies))
		{
			unsigned currLen = (unsigned)strlen(ctx.errorBuf);
			NULLC::SafeSprintf(ctx.errorBuf + currLen, ctx.errorBufSize - currLen, " [in module '%.*s']", FMT_ISTR(data->name));

			compilerCtx.outputCtx.closeStream(compilerCtx.outputCtx.stream);
			compilerCtx.outputCtx.stream = NULL;

			if(!bytecodeFile)
				NULLC::fileFree(fileContent);

			return false;
		}

		compilerCtx.outputCtx.closeStream(compilerCtx.outputCtx.stream);
		compilerCtx.outputCtx.stream = NULL;

		if(!bytecodeFile)
			NULLC::fileFree(fileContent);
	}

	// Translate all imports (expept base)
	for(unsigned i = 1; i < ctx.ctx.imports.size(); i++)
	{
		ModuleData* data = ctx.ctx.imports[i];

		PrintIndentedLine(ctx, "// Requires '%.*s'", FMT_ISTR(data->name));
	}

	return true;
}